

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

Cord __thiscall absl::lts_20250127::Cord::Subcord(Cord *this,size_t pos,size_t new_size)

{
  RefcountAndFlags *pRVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  uint8_t uVar4;
  bool bVar5;
  ulong uVar6;
  CordRepBtree *pCVar7;
  undefined8 extraout_RAX;
  CordRepBtree *in_RCX;
  CordRepBtree *pCVar8;
  CordRepBtree *pCVar9;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar10;
  uint *extraout_RDX_01;
  long lVar11;
  CordRepBtree *pCVar12;
  CordRepBtree *n;
  Cord CVar13;
  ChunkIterator it;
  ChunkIterator local_c8;
  
  (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
  (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  uVar6 = (ulong)(char)*(byte *)pos;
  if ((uVar6 & 1) == 0) {
    pCVar12 = (CordRepBtree *)(uVar6 >> 1);
    puVar10 = (uint *)new_size;
  }
  else {
    puVar10 = *(uint **)(pos + 8);
    pCVar12 = *(CordRepBtree **)puVar10;
  }
  if (pCVar12 < new_size) {
    new_size = (size_t)pCVar12;
  }
  n = (CordRepBtree *)((long)pCVar12 - new_size);
  if (in_RCX <= (CordRepBtree *)((long)pCVar12 - new_size)) {
    n = in_RCX;
  }
  if (n != (CordRepBtree *)0x0) {
    pCVar12 = *(CordRepBtree **)(pos + 8);
    if (pCVar12 == (CordRepBtree *)0x0 || (*(byte *)pos & 1) == 0) {
      lVar11 = 0;
      if ((uVar6 & 1) == 0) {
        lVar11 = pos + 1;
      }
      cord_internal::InlineData::set_inline_data
                ((InlineData *)this,
                 (char *)((((CordRepBtree *)new_size)->super_CordRep).storage + lVar11 + -0xd),
                 (size_t)n);
      puVar10 = extraout_RDX;
    }
    else {
      if (n < (CordRepBtree *)&DAT_00000010) {
        (this->contents_).data_.rep_.field_0.data[0] = (char)n * '\x02';
        local_c8.current_leaf_ = (Nullable<absl::cord_internal::CordRep_*>)0x0;
        local_c8.current_chunk_ = (string_view)ZEXT816(0);
        local_c8.btree_reader_.remaining_ = 0;
        local_c8.btree_reader_.navigator_.height_ = -1;
        local_c8.bytes_remaining_ = (pCVar12->super_CordRep).length;
        if ((CordRepBtree *)local_c8.bytes_remaining_ == (CordRepBtree *)0x0) {
          local_c8.current_chunk_ = (string_view)ZEXT816(0);
          pCVar7 = (CordRepBtree *)0x0;
        }
        else {
          ChunkIterator::InitTree(&local_c8,&pCVar12->super_CordRep);
          pCVar7 = (CordRepBtree *)local_c8.bytes_remaining_;
        }
        if (pCVar7 < new_size) {
          __assert_fail("bytes_remaining_ >= n",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                        ,0x63d,"void absl::Cord::ChunkIterator::AdvanceBytes(size_t)");
        }
        if (local_c8.current_chunk_._M_len < new_size ||
            local_c8.current_chunk_._M_len - new_size == 0) {
          pCVar8 = pCVar7;
          if ((CordRepBtree *)new_size != (CordRepBtree *)0x0) {
            if (((long)local_c8.btree_reader_.navigator_.height_ < 0) ||
               (local_c8.btree_reader_.navigator_.node_[local_c8.btree_reader_.navigator_.height_]
                == (CordRepBtree *)0x0)) {
              local_c8.bytes_remaining_ = 0;
              Subcord();
              ~Cord(this);
              _Unwind_Resume(extraout_RAX);
            }
            pCVar12 = (CordRepBtree *)new_size;
            ChunkIterator::AdvanceBytesBtree(&local_c8,new_size);
            pCVar8 = (CordRepBtree *)local_c8.bytes_remaining_;
          }
        }
        else {
          local_c8.current_chunk_._M_str = local_c8.current_chunk_._M_str + new_size;
          local_c8.current_chunk_._M_len = local_c8.current_chunk_._M_len - new_size;
          pCVar8 = (CordRepBtree *)((long)pCVar7 - new_size);
          local_c8.bytes_remaining_ = (long)pCVar7 - new_size;
        }
        if (pCVar8 != (CordRepBtree *)0x0) {
          pos = (size_t)((this->contents_).data_.rep_.field_0.data + 1);
          new_size = (size_t)&local_c8.btree_reader_;
          pCVar7 = (CordRepBtree *)local_c8.current_chunk_._M_len;
          do {
            pCVar12 = n;
            n = (CordRepBtree *)((long)pCVar12 - (long)pCVar7);
            if (pCVar12 < pCVar7 || n == (CordRepBtree *)0x0) {
              puVar10 = (uint *)local_c8.current_chunk_._M_str;
              if (pCVar12 < (CordRepBtree *)&DAT_00000008) {
                if (pCVar12 < (CordRepBtree *)&DAT_00000004) {
                  if (pCVar12 != (CordRepBtree *)0x0) {
                    *(char *)pos = *local_c8.current_chunk_._M_str;
                    *(uint8_t *)(pos + ((ulong)pCVar12 >> 1)) =
                         *(uint8_t *)((long)local_c8.current_chunk_._M_str + ((ulong)pCVar12 >> 1));
                    *(undefined1 *)((long)pCVar12[-1].edges_ + pos + 0x2f) =
                         *(undefined1 *)
                          ((long)local_c8.current_chunk_._M_str +
                          (long)((long)pCVar12[-1].edges_ + 0x2f));
                  }
                }
                else {
                  uVar2 = *(undefined4 *)
                           ((long)((long)local_c8.current_chunk_._M_str + -4) + (long)pCVar12);
                  *(uint *)pos = *(uint *)local_c8.current_chunk_._M_str;
                  *(undefined4 *)((long)pCVar12[-1].edges_ + (long)(pos + 0x2c)) = uVar2;
                }
              }
              else {
                if ((CordRepBtree *)&DAT_0000000f < pCVar12) {
LAB_00fe97a4:
                  __assert_fail("n <= 15",
                                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                                ,0x62,
                                "void absl::cord_internal::SmallMemmove(char *, const char *, size_t) [nullify_tail = false]"
                               );
                }
                uVar3 = *(undefined8 *)
                         ((long)((long)local_c8.current_chunk_._M_str + -8) + (long)pCVar12);
                *(undefined8 *)pos = *(undefined8 *)local_c8.current_chunk_._M_str;
                *(undefined8 *)((long)pCVar12[-1].edges_ + (long)(pos + 0x28)) = uVar3;
              }
              goto LAB_00fe96f1;
            }
            if (pCVar7 < (CordRepBtree *)&DAT_00000008) {
              if (pCVar7 < (CordRepBtree *)&DAT_00000004) {
                if (pCVar7 != (CordRepBtree *)0x0) {
                  *(char *)pos = *local_c8.current_chunk_._M_str;
                  pCVar12 = (CordRepBtree *)((ulong)pCVar7 >> 1);
                  (pCVar12->super_CordRep).storage[(long)(pos + -0xd)] =
                       *(uint8_t *)((long)local_c8.current_chunk_._M_str + (long)pCVar12);
                  *(undefined1 *)((long)pCVar7[-1].edges_ + pos + 0x2f) =
                       *(undefined1 *)
                        ((long)local_c8.current_chunk_._M_str +
                        (long)((long)pCVar7[-1].edges_ + 0x2f));
                }
              }
              else {
                pCVar12 = (CordRepBtree *)(ulong)*(uint *)local_c8.current_chunk_._M_str;
                uVar2 = *(undefined4 *)
                         ((long)((long)local_c8.current_chunk_._M_str + -4) + (long)pCVar7);
                *(uint *)pos = *(uint *)local_c8.current_chunk_._M_str;
                *(undefined4 *)((long)pCVar7[-1].edges_ + (long)(pos + 0x2c)) = uVar2;
              }
            }
            else {
              if ((CordRepBtree *)&DAT_0000000f < pCVar7) goto LAB_00fe97a4;
              pCVar12 = *(CordRepBtree **)local_c8.current_chunk_._M_str;
              uVar3 = *(undefined8 *)
                       ((long)((long)local_c8.current_chunk_._M_str + -8) + (long)pCVar7);
              *(CordRepBtree **)pos = pCVar12;
              *(undefined8 *)((long)pCVar7[-1].edges_ + (long)(pos + 0x28)) = uVar3;
            }
            pos = (size_t)((pCVar7->super_CordRep).storage + (long)(pos + -0xd));
            pCVar9 = (CordRepBtree *)((long)pCVar8 - (long)pCVar7);
            if (pCVar8 < pCVar7) {
              __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                            ,0x611,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
            }
            local_c8.bytes_remaining_ = (size_t)pCVar9;
            if (pCVar9 != (CordRepBtree *)0x0) {
              if (((long)local_c8.btree_reader_.navigator_.height_ < 0) ||
                 (local_c8.btree_reader_.navigator_.node_[local_c8.btree_reader_.navigator_.height_]
                  == (CordRepBtree *)0x0)) {
                if (pCVar7 == (CordRepBtree *)0x0) {
                  __assert_fail("!current_chunk_.empty()",
                                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                                ,0x617,
                                "Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
                }
                local_c8.current_chunk_ = (string_view)ZEXT816(0);
                pCVar7 = (CordRepBtree *)0x0;
              }
              else {
                local_c8.current_chunk_ =
                     cord_internal::CordRepBtreeReader::Next((CordRepBtreeReader *)new_size);
                pCVar7 = (CordRepBtree *)local_c8.current_chunk_._M_len;
              }
            }
            pCVar8 = (CordRepBtree *)local_c8.bytes_remaining_;
          } while ((CordRepBtree *)local_c8.bytes_remaining_ != (CordRepBtree *)0x0);
        }
        Subcord();
      }
      uVar4 = (pCVar12->super_CordRep).tag;
      if (uVar4 == '\x02') {
        pCVar12 = (CordRepBtree *)pCVar12->edges_[0];
        uVar4 = (pCVar12->super_CordRep).tag;
      }
      if (uVar4 == '\x03') {
        pCVar12 = (CordRepBtree *)cord_internal::CordRepBtree::SubTree(pCVar12,new_size,(size_t)n);
      }
      else {
        pCVar7 = (CordRepBtree *)(pCVar12->super_CordRep).length;
        if (pCVar7 <= new_size) {
          __assert_fail("pos < rep->length",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x1a5,
                        "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                       );
        }
        if ((CordRepBtree *)((long)pCVar7 - new_size) < n) {
          __assert_fail("n <= rep->length - pos",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x1a6,
                        "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                       );
        }
        if (pCVar7 == n) {
          LOCK();
          pRVar1 = &(pCVar12->super_CordRep).refcount;
          (pRVar1->count_).super___atomic_base<int>._M_i =
               (pRVar1->count_).super___atomic_base<int>._M_i + 2;
          UNLOCK();
        }
        else {
          pCVar7 = pCVar12;
          if (uVar4 == '\x01') {
            new_size = (size_t)(pCVar12->edges_[0]->storage +
                               (long)((((CordRepBtree *)new_size)->super_CordRep).storage + -0x1a));
            pCVar7 = (CordRepBtree *)pCVar12->edges_[1];
          }
          pCVar12 = (CordRepBtree *)operator_new(0x20);
          (pCVar12->super_CordRep).length = 0;
          (pCVar12->super_CordRep).refcount = (atomic<int>)0x0;
          (pCVar12->super_CordRep).tag = '\0';
          (pCVar12->super_CordRep).storage[0] = '\0';
          (pCVar12->super_CordRep).storage[1] = '\0';
          (pCVar12->super_CordRep).storage[2] = '\0';
          (pCVar12->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
          (pCVar12->super_CordRep).length = (size_t)n;
          (pCVar12->super_CordRep).tag = '\x01';
          pCVar12->edges_[0] = (CordRep *)new_size;
          if (pCVar7 == (CordRepBtree *)0x0) {
            __assert_fail("rep != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                          ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
          }
          LOCK();
          pRVar1 = &(pCVar7->super_CordRep).refcount;
          (pRVar1->count_).super___atomic_base<int>._M_i =
               (pRVar1->count_).super___atomic_base<int>._M_i + 2;
          UNLOCK();
          pCVar12->edges_[1] = &pCVar7->super_CordRep;
        }
      }
      (this->contents_).data_.rep_.field_0.as_tree.rep = &pCVar12->super_CordRep;
      (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 1;
      bVar5 = cord_internal::InlineData::is_either_profiled((InlineData *)this,(InlineData *)pos);
      puVar10 = extraout_RDX_00;
      if (bVar5) {
        cord_internal::CordzInfo::MaybeTrackCordImpl((InlineData *)this,(InlineData *)pos,kSubCord);
        puVar10 = extraout_RDX_01;
      }
    }
  }
LAB_00fe96f1:
  CVar13.contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)puVar10;
  CVar13.contents_.data_.rep_.field_0.as_tree.cordz_info = (cordz_info_t)this;
  return (Cord)CVar13.contents_.data_.rep_.field_0;
}

Assistant:

Cord Cord::Subcord(size_t pos, size_t new_size) const {
  Cord sub_cord;
  size_t length = size();
  if (pos > length) pos = length;
  if (new_size > length - pos) new_size = length - pos;
  if (new_size == 0) return sub_cord;

  CordRep* tree = contents_.tree();
  if (tree == nullptr) {
    sub_cord.contents_.set_data(contents_.data() + pos, new_size);
    return sub_cord;
  }

  if (new_size <= InlineRep::kMaxInline) {
    sub_cord.contents_.set_inline_size(new_size);
    char* dest = sub_cord.contents_.data_.as_chars();
    Cord::ChunkIterator it = chunk_begin();
    it.AdvanceBytes(pos);
    size_t remaining_size = new_size;
    while (remaining_size > it->size()) {
      cord_internal::SmallMemmove(dest, it->data(), it->size());
      remaining_size -= it->size();
      dest += it->size();
      ++it;
    }
    cord_internal::SmallMemmove(dest, it->data(), remaining_size);
    return sub_cord;
  }

  tree = cord_internal::SkipCrcNode(tree);
  if (tree->IsBtree()) {
    tree = tree->btree()->SubTree(pos, new_size);
  } else {
    tree = CordRepSubstring::Substring(tree, pos, new_size);
  }
  sub_cord.contents_.EmplaceTree(tree, contents_.data_,
                                 CordzUpdateTracker::kSubCord);
  return sub_cord;
}